

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateFunctionCall4(ExpressionContext *ctx,SynBase *source,InplaceStr name,ExprBase *arg0,
                   ExprBase *arg1,ExprBase *arg2,ExprBase *arg3,bool allowFailure,bool allowInternal
                   ,bool allowFastLookup)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  ExprBase *pEVar4;
  long lVar5;
  ArrayView<ArgumentData> arguments_00;
  char *local_118;
  char *local_110;
  SmallArray<ArgumentData,_4U> arguments;
  
  local_110 = name.end;
  local_118 = name.begin;
  pAVar1 = ctx->allocator;
  lVar5 = 0x20;
  do {
    *(undefined8 *)((long)&local_118 + lVar5) = 0;
    *(undefined1 *)((long)arguments.little + lVar5 + -0x18) = 0;
    *(undefined8 *)((long)arguments.little + lVar5 + -0x10) = 0;
    *(undefined8 *)((long)arguments.little + lVar5 + -8) = 0;
    *(undefined8 *)((long)&arguments.little[0].source + lVar5) = 0;
    *(undefined8 *)(&arguments.little[0].isExplicit + lVar5) = 0;
    lVar5 = lVar5 + 0x30;
  } while (lVar5 != 0xe0);
  arguments.data = arguments.little;
  arguments.little[0].source = arg0->source;
  arguments.little[0].type = arg0->type;
  arguments.count = 1;
  pSVar2 = arg1->source;
  pTVar3 = arg1->type;
  arguments.little[0].value = arg0;
  arguments.allocator = pAVar1;
  if (arguments.data != (ArgumentData *)0x0) {
    arguments.little[1].isExplicit = false;
    arguments.little[1].name = (SynIdentifier *)0x0;
    arguments.little[1].valueFunction = (FunctionData *)0x0;
    arguments.count = 2;
    arguments.little[1].source = pSVar2;
    arguments.little[1].type = pTVar3;
    arguments.little[1].value = arg1;
    if (arguments.data != (ArgumentData *)0x0) {
      arguments.little[2].isExplicit = false;
      arguments.little[2].name = (SynIdentifier *)0x0;
      arguments.little[2].value = arg2;
      arguments.little[2].valueFunction = (FunctionData *)0x0;
      arguments.little[3].source = arg3->source;
      arguments.little[3].type = arg3->type;
      arguments.little[1].valueFunction = (FunctionData *)0x0;
      arguments.little[1].name = (SynIdentifier *)0x0;
      arguments.little[1].isExplicit = false;
      arguments.little[0].valueFunction = (FunctionData *)0x0;
      arguments.little[0].name = (SynIdentifier *)0x0;
      arguments.little[0].isExplicit = false;
      arguments.max = 4;
      arguments.count = 3;
      arguments.little[2].source = arg2->source;
      arguments.little[2].type = arg2->type;
      if (arguments.data != (ArgumentData *)0x0) {
        arguments.count = 4;
        arguments.little[3].isExplicit = false;
        arguments.little[3].name = (SynIdentifier *)0x0;
        arguments.little[3].value = arg3;
        arguments.little[3].valueFunction = (FunctionData *)0x0;
        arguments_00.count = 4;
        arguments_00.data = arguments.data;
        arguments_00._12_4_ = 0;
        pEVar4 = CreateFunctionCallByName
                           (ctx,source,name,arguments_00,allowFailure,allowInternal,allowFastLookup)
        ;
        SmallArray<ArgumentData,_4U>::~SmallArray(&arguments);
        return pEVar4;
      }
    }
  }
  arguments.little[0].valueFunction = (FunctionData *)0x0;
  arguments.little[0].name = (SynIdentifier *)0x0;
  arguments.little[0].isExplicit = false;
  arguments.max = 4;
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<ArgumentData, 4>::push_back(const T &) [T = ArgumentData, N = 4]");
}

Assistant:

ExprBase* CreateFunctionCall4(ExpressionContext &ctx, SynBase *source, InplaceStr name, ExprBase *arg0, ExprBase *arg1, ExprBase *arg2, ExprBase *arg3, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	SmallArray<ArgumentData, 4> arguments(ctx.allocator);

	arguments.push_back(ArgumentData(arg0->source, false, NULL, arg0->type, arg0));
	arguments.push_back(ArgumentData(arg1->source, false, NULL, arg1->type, arg1));
	arguments.push_back(ArgumentData(arg2->source, false, NULL, arg2->type, arg2));
	arguments.push_back(ArgumentData(arg3->source, false, NULL, arg3->type, arg3));

	return CreateFunctionCallByName(ctx, source, name, arguments, allowFailure, allowInternal, allowFastLookup);
}